

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O3

void tcu::separableConvolve<4,3>
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,int shiftX,int shiftY,
               vector<float,_std::allocator<float>_> *kernelX,
               vector<float,_std::allocator<float>_> *kernelY)

{
  float fVar1;
  ushort uVar2;
  undefined4 uVar3;
  pointer pfVar4;
  pointer pfVar5;
  void *pvVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  PixelBufferAccess tmpAccess;
  TextureLevel tmp;
  int local_dc;
  long local_c8;
  PixelBufferAccess local_80;
  TextureLevel local_58;
  
  TextureLevel::TextureLevel
            (&local_58,(TextureFormat *)dst,(dst->super_ConstPixelBufferAccess).m_size.m_data[1],
             (dst->super_ConstPixelBufferAccess).m_size.m_data[0],1);
  TextureLevel::getAccess(&local_80,&local_58);
  iVar13 = (src->m_size).m_data[1];
  if (0 < iVar13) {
    pfVar4 = (kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = (ulong)((long)(kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar4) >> 2;
    pfVar5 = (kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (ulong)((long)(kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar5) >> 2;
    iVar21 = (src->m_size).m_data[0];
    uVar14 = (uint)uVar19;
    local_c8 = 0;
    do {
      if (0 < iVar21) {
        pvVar6 = src->m_data;
        iVar12 = 0;
        iVar13 = -shiftX;
        do {
          if ((int)uVar14 < 1) {
            auVar25 = (undefined1  [16])0x0;
          }
          else {
            iVar15 = (src->m_pitch).m_data[1] * (int)local_c8;
            fVar24 = 0.0;
            fVar26 = 0.0;
            fVar27 = 0.0;
            fVar28 = 0.0;
            uVar20 = (ulong)(uVar14 & 0x7fffffff);
            iVar23 = iVar13;
            lVar17 = uVar19 << 0x20;
            do {
              lVar17 = lVar17 + -0x100000000;
              iVar22 = iVar21 + -1;
              if (iVar23 < iVar21 + -1) {
                iVar22 = iVar23;
              }
              iVar22 = iVar22 * 3;
              if (iVar23 < 0) {
                iVar22 = 0;
              }
              uVar2 = *(ushort *)((long)pvVar6 + (long)iVar22 + (long)iVar15);
              fVar1 = *(float *)((long)pfVar4 + (lVar17 >> 0x1e));
              fVar24 = fVar24 + fVar1 * (float)(uVar2 & 0xff);
              fVar26 = fVar26 + fVar1 * (float)(byte)(uVar2 >> 8);
              fVar27 = fVar27 + fVar1 * (float)*(byte *)((long)pvVar6 +
                                                        (long)iVar22 + (long)iVar15 + 2);
              fVar28 = fVar28 + fVar1 * 255.0;
              iVar23 = iVar23 + 1;
              uVar20 = uVar20 - 1;
            } while (uVar20 != 0);
            auVar25._0_4_ = (int)(fVar24 + 0.5);
            auVar25._4_4_ = (int)(fVar26 + 0.5);
            auVar25._8_4_ = (int)(fVar27 + 0.5);
            auVar25._12_4_ = (int)(fVar28 + 0.5);
          }
          uVar16 = auVar25._0_4_;
          if (0xfe < (int)uVar16) {
            uVar16 = 0xff;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          iVar21 = auVar25._4_4_;
          iVar23 = auVar25._8_4_;
          iVar15 = auVar25._12_4_;
          if (0xfe < iVar21) {
            iVar21 = 0xff;
          }
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          if (0xfe < iVar23) {
            iVar23 = 0xff;
          }
          if (iVar23 < 1) {
            iVar23 = 0;
          }
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          *(uint *)((long)local_80.super_ConstPixelBufferAccess.m_data +
                   (long)(local_80.super_ConstPixelBufferAccess.m_pitch.m_data[1] * iVar12) +
                   (long)((int)local_c8 * 4)) =
               iVar15 << 0x18 | iVar23 << 0x10 | iVar21 << 8 | uVar16;
          iVar12 = iVar12 + 1;
          iVar21 = (src->m_size).m_data[0];
          iVar13 = iVar13 + 1;
        } while (iVar12 < iVar21);
        iVar13 = (src->m_size).m_data[1];
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 < iVar13);
    if (0 < iVar13) {
      pvVar6 = (dst->super_ConstPixelBufferAccess).m_data;
      uVar19 = (ulong)(uint)(src->m_size).m_data[0];
      uVar14 = (uint)uVar11;
      local_dc = -shiftY;
      iVar21 = 0;
      do {
        if (0 < (int)uVar19) {
          lVar17 = 0;
          do {
            if ((int)uVar14 < 1) {
              uVar16 = 0;
              iVar12 = 0;
              iVar13 = 0;
              iVar23 = 0;
            }
            else {
              fVar24 = 0.0;
              fVar26 = 0.0;
              fVar27 = 0.0;
              fVar28 = 0.0;
              uVar19 = (ulong)(uVar14 & 0x7fffffff);
              iVar13 = local_dc;
              lVar18 = uVar11 << 0x20;
              do {
                lVar18 = lVar18 + -0x100000000;
                iVar12 = local_58.m_size.m_data[0] + -1;
                if (iVar13 < local_58.m_size.m_data[0] + -1) {
                  iVar12 = iVar13;
                }
                iVar12 = iVar12 << 2;
                if (iVar13 < 0) {
                  iVar12 = 0;
                }
                uVar3 = *(undefined4 *)
                         ((long)local_80.super_ConstPixelBufferAccess.m_data +
                         (long)iVar12 +
                         (long)(local_80.super_ConstPixelBufferAccess.m_pitch.m_data[1] *
                               (int)lVar17));
                uVar20 = (ulong)(ushort)uVar3 & 0xffffffffffff00ff;
                auVar7._8_4_ = 0;
                auVar7._0_8_ = uVar20;
                auVar7[0xc] = (char)((uint)uVar3 >> 0x18);
                auVar8[8] = (char)((uint)uVar3 >> 0x10);
                auVar8._0_8_ = uVar20;
                auVar8[9] = 0;
                auVar8._10_3_ = auVar7._10_3_;
                auVar10._5_8_ = 0;
                auVar10._0_5_ = auVar8._8_5_;
                auVar9[4] = (char)((uint)uVar3 >> 8);
                auVar9._0_4_ = (int)uVar20;
                auVar9[5] = 0;
                auVar9._6_7_ = SUB137(auVar10 << 0x40,6);
                fVar1 = *(float *)((long)pfVar5 + (lVar18 >> 0x1e));
                fVar24 = fVar24 + fVar1 * (float)(int)uVar20;
                fVar26 = fVar26 + fVar1 * (float)auVar9._4_4_;
                fVar27 = fVar27 + fVar1 * (float)auVar8._8_4_;
                fVar28 = fVar28 + fVar1 * (float)(uint3)(auVar7._10_3_ >> 0x10);
                iVar13 = iVar13 + 1;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
              uVar16 = (uint)(fVar24 + 0.5);
              iVar12 = (int)(fVar26 + 0.5);
              iVar13 = (int)(fVar27 + 0.5);
              iVar23 = (int)(fVar28 + 0.5);
            }
            if (0xfe < (int)uVar16) {
              uVar16 = 0xff;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            if (0xfe < iVar12) {
              iVar12 = 0xff;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            if (0xfe < iVar23) {
              iVar23 = 0xff;
            }
            if (iVar23 < 1) {
              iVar23 = 0;
            }
            *(uint *)((long)pvVar6 +
                     (long)((int)lVar17 << 2) +
                     (long)((dst->super_ConstPixelBufferAccess).m_pitch.m_data[1] * iVar21)) =
                 iVar23 << 0x18 | iVar13 << 0x10 | iVar12 << 8 | uVar16;
            lVar17 = lVar17 + 1;
            uVar19 = (ulong)(src->m_size).m_data[0];
          } while (lVar17 < (long)uVar19);
          iVar13 = (src->m_size).m_data[1];
        }
        iVar21 = iVar21 + 1;
        local_dc = local_dc + 1;
      } while (iVar21 < iVar13);
    }
  }
  TextureLevel::~TextureLevel(&local_58);
  return;
}

Assistant:

static void separableConvolve (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, int shiftX, int shiftY, const std::vector<float>& kernelX, const std::vector<float>& kernelY)
{
	DE_ASSERT(dst.getWidth() == src.getWidth() && dst.getHeight() == src.getHeight());

	TextureLevel		tmp			(dst.getFormat(), dst.getHeight(), dst.getWidth());
	PixelBufferAccess	tmpAccess	= tmp.getAccess();

	int kw = (int)kernelX.size();
	int kh = (int)kernelY.size();

	// Horizontal pass
	// \note Temporary surface is written in column-wise order
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0);

			for (int kx = 0; kx < kw; kx++)
			{
				float		f = kernelX[kw-kx-1];
				deUint32	p = readUnorm8<SrcChannels>(src, de::clamp(i+kx-shiftX, 0, src.getWidth()-1), j);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(tmpAccess, j, i, toColor(sum));
		}
	}

	// Vertical pass
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0.0f);

			for (int ky = 0; ky < kh; ky++)
			{
				float		f = kernelY[kh-ky-1];
				deUint32	p = readUnorm8<DstChannels>(tmpAccess, de::clamp(j+ky-shiftY, 0, tmp.getWidth()-1), i);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(dst, i, j, toColor(sum));
		}
	}
}